

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

void nn_cinproc_connect(nn_ins_item *self,nn_ins_item *peer)

{
  nn_fsm *local_38;
  nn_fsm *local_30;
  nn_binproc *binproc;
  nn_cinproc *cinproc;
  nn_ins_item *peer_local;
  nn_ins_item *self_local;
  
  if (self == (nn_ins_item *)0x0) {
    local_30 = (nn_fsm *)0x0;
  }
  else {
    local_30 = (nn_fsm *)&self[-3].item.prev;
  }
  if (peer == (nn_ins_item *)0x0) {
    local_38 = (nn_fsm *)0x0;
  }
  else {
    local_38 = (nn_fsm *)&peer[-3].item.prev;
  }
  if (*(int *)&local_30[1].fn != 2) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)&local_30[1].fn,
            "NN_CINPROC_STATE_DISCONNECTED",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
            ,0x73);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_sinproc_connect((nn_sinproc *)&local_30[1].stopped,local_38);
  nn_fsm_action(local_30,1);
  return;
}

Assistant:

static void nn_cinproc_connect (struct nn_ins_item *self,
    struct nn_ins_item *peer)
{
    struct nn_cinproc *cinproc;
    struct nn_binproc *binproc;

    cinproc = nn_cont (self, struct nn_cinproc, item);
    binproc = nn_cont (peer, struct nn_binproc, item);

    nn_assert_state (cinproc, NN_CINPROC_STATE_DISCONNECTED);
    nn_sinproc_connect (&cinproc->sinproc, &binproc->fsm);
    nn_fsm_action (&cinproc->fsm, NN_CINPROC_ACTION_CONNECT);
}